

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall
indigox::utils::
Graph<indigox::TDVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::Graph
          (Graph<indigox::TDVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
           *this)

{
  long in_RDI;
  allocator_type *al;
  bimap<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na> *in_stack_ffffffffffffffe0;
  allocator_type local_9 [9];
  
  std::
  make_shared<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::TDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>>
            ();
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  al = local_9;
  std::
  allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
  ::allocator((allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
               *)0x19776d);
  boost::bimaps::bimap<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::bimap
            (in_stack_ffffffffffffffe0,al);
  std::
  allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
  ::~allocator((allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
                *)0x197788);
  std::
  allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
  ::allocator((allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
               *)0x1977a5);
  boost::bimaps::
  bimap<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>
  ::bimap((bimap<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>
           *)in_stack_ffffffffffffffe0,(allocator_type *)al);
  std::
  allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
  ::~allocator((allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
                *)0x1977c0);
  return;
}

Assistant:

Graph() : graph_(std::make_shared<T>())
      {}